

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

int queue_5_3::enQueue(sq_queue *q,int e)

{
  bool bVar1;
  allocator local_31;
  string local_30;
  
  bVar1 = q->front != (q->rear + 1) % q->ssize;
  if (bVar1) {
    q->data[q->rear] = e;
    q->rear = (q->rear + 1) % q->ssize;
  }
  else {
    std::__cxx11::string::string((string *)&local_30,anon_var_dwarf_1b5e,&local_31);
    errCode(&local_30,0);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return (uint)bVar1;
}

Assistant:

int enQueue(sq_queue &q, int e) {
        if (q.front == (q.rear + 1) % q.ssize)
            return errCode("满队", 0);
        q.data[q.rear] = e;
        q.rear = (q.rear + 1) % q.ssize;
        return 1;
    }